

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int cm_zlib_inflateGetDictionary(z_streamp strm,Bytef *dictionary,uInt *dictLength)

{
  internal_state *piVar1;
  int iVar2;
  inflate_state *state;
  uInt *dictLength_local;
  Bytef *dictionary_local;
  z_streamp strm_local;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (((int)piVar1->gzindex != 0) && (dictionary != (Bytef *)0x0)) {
      memcpy(dictionary,
             (void *)(*(long *)&piVar1->method + (ulong)*(uint *)((long)&piVar1->gzindex + 4)),
             (ulong)(uint)((int)piVar1->gzindex - *(int *)((long)&piVar1->gzindex + 4)));
      memcpy(dictionary +
             ((ulong)(uint)piVar1->gzindex - (ulong)*(uint *)((long)&piVar1->gzindex + 4)),
             *(void **)&piVar1->method,(ulong)*(uint *)((long)&piVar1->gzindex + 4));
    }
    if (dictLength != (uInt *)0x0) {
      *dictLength = (uInt)piVar1->gzindex;
    }
    strm_local._4_4_ = 0;
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateGetDictionary(z_streamp strm, Bytef *dictionary,
                                 uInt *dictLength) {
    struct inflate_state FAR *state;

    /* check state */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* copy dictionary */
    if (state->whave && dictionary != Z_NULL) {
        zmemcpy(dictionary, state->window + state->wnext,
                state->whave - state->wnext);
        zmemcpy(dictionary + state->whave - state->wnext,
                state->window, state->wnext);
    }
    if (dictLength != Z_NULL)
        *dictLength = state->whave;
    return Z_OK;
}